

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O3

parser_error parse_curse_conflict(parser *p)

{
  parser_error pVar1;
  void *pvVar2;
  char *pcVar3;
  char *s2;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    pVar1 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = string_append(*(char **)((long)pvVar2 + 0x20),"|");
    *(char **)((long)pvVar2 + 0x20) = pcVar3;
    s2 = parser_getstr(p,"conf");
    pcVar3 = string_append(pcVar3,s2);
    *(char **)((long)pvVar2 + 0x20) = pcVar3;
    pcVar3 = string_append(pcVar3,"|");
    *(char **)((long)pvVar2 + 0x20) = pcVar3;
    pVar1 = PARSE_ERROR_NONE;
  }
  return pVar1;
}

Assistant:

static enum parser_error parse_curse_conflict(struct parser *p) {
	struct curse *curse = parser_priv(p);

	if (!curse) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	curse->conflict = string_append(curse->conflict, "|");
	curse->conflict = string_append(curse->conflict, parser_getstr(p, "conf"));
	curse->conflict = string_append(curse->conflict, "|");
	return PARSE_ERROR_NONE;
}